

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_surf(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong global;
  REF_INT new_node;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT dummy;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_DBL xyz [3];
  REF_INT nodes [27];
  char buffer [1024];
  uint local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  undefined1 local_4d4 [4];
  int local_4d0;
  int local_4cc;
  REF_DBL local_4c8;
  REF_DBL local_4c0;
  REF_DBL local_4b8;
  REF_CELL local_4b0;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined4 local_498;
  char local_438 [1032];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x192,"ref_import_surf","unable to open file");
      uVar3 = 2;
    }
    else {
      iVar4 = __isoc99_fscanf(__stream,"%d",&local_4dc);
      if (iVar4 == 1) {
        iVar4 = __isoc99_fscanf(__stream,"%d",&local_4e0);
        if (iVar4 == 1) {
          iVar4 = __isoc99_fscanf(__stream,"%d",&local_4d8);
          if (iVar4 == 1) {
            if (0 < local_4d8) {
              global = 0;
              do {
                uVar3 = ref_node_add(ref_node,global,(REF_INT *)&local_4e4);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x199,"ref_import_surf",(ulong)uVar3,"new_node");
                  return uVar3;
                }
                if (global != local_4e4) {
                  pcVar9 = "node index";
                  uVar8 = 0x19a;
                  goto LAB_0016c626;
                }
                iVar4 = __isoc99_fscanf(__stream,"%lf",&local_4c8);
                if (iVar4 != 1) {
                  pcVar9 = "x";
                  uVar8 = 0x19b;
                  goto LAB_0016c626;
                }
                iVar4 = __isoc99_fscanf(__stream,"%lf",&local_4c0);
                if (iVar4 != 1) {
                  pcVar9 = "y";
                  uVar8 = 0x19c;
                  goto LAB_0016c626;
                }
                iVar4 = __isoc99_fscanf(__stream,"%lf",&local_4b8);
                if (iVar4 != 1) {
                  pcVar9 = "z";
                  uVar8 = 0x19d;
                  goto LAB_0016c626;
                }
                pRVar2 = ref_node->real;
                lVar7 = (long)(int)local_4e4;
                pRVar2[lVar7 * 0xf] = local_4c8;
                pRVar2[lVar7 * 0xf + 1] = local_4c0;
                pRVar2[lVar7 * 0xf + 2] = local_4b8;
                fgets(local_438,0x400,__stream);
                global = global + 1;
              } while ((long)global < (long)local_4d8);
            }
            uVar3 = ref_node_initialize_n_global(ref_node,(long)local_4d8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x1a4,"ref_import_surf",(ulong)uVar3,"init glob");
              return uVar3;
            }
            local_49c = -1;
            if (0 < local_4dc) {
              iVar4 = 0;
              local_4b0 = pRVar1->cell[3];
              do {
                lVar7 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_4a8 + lVar7);
                  if (iVar5 != 1) {
                    pcVar9 = "tri";
                    uVar8 = 0x1aa;
                    goto LAB_0016c626;
                  }
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0x10);
                iVar5 = 1;
                do {
                  iVar6 = __isoc99_fscanf(__stream,"%d",local_4d4);
                  if (iVar6 != 1) {
                    pcVar9 = "extra 0 1";
                    uVar8 = 0x1ac;
                    goto LAB_0016c626;
                  }
                  iVar5 = iVar5 + -1;
                } while (iVar5 == 0);
                local_4a8 = local_4a8 + -1;
                local_4a4 = local_4a4 + -1;
                local_4a0 = local_4a0 + -1;
                uVar3 = ref_cell_add(local_4b0,&local_4a8,&local_4cc);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x1b0,"ref_import_surf",(ulong)uVar3,"new tri");
                  return uVar3;
                }
                if (iVar4 != local_4cc) {
                  pcVar9 = "tri index";
                  uVar8 = 0x1b1;
                  goto LAB_0016c626;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_4dc);
            }
            ref_cell = pRVar1->cell[6];
            local_498 = 0xffffffff;
            if (0 < local_4e0) {
              iVar4 = 0;
              do {
                lVar7 = 0;
                do {
                  iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_4a8 + lVar7);
                  if (iVar5 != 1) {
                    pcVar9 = "qua";
                    uVar8 = 0x1b8;
                    goto LAB_0016c626;
                  }
                  lVar7 = lVar7 + 4;
                } while (lVar7 != 0x14);
                iVar5 = 1;
                do {
                  iVar6 = __isoc99_fscanf(__stream,"%d",local_4d4);
                  if (iVar6 != 1) {
                    pcVar9 = "extra 0 1";
                    uVar8 = 0x1ba;
                    goto LAB_0016c626;
                  }
                  iVar5 = iVar5 + -1;
                } while (iVar5 == 0);
                local_4a8 = local_4a8 + -1;
                local_4a4 = local_4a4 + -1;
                local_4a0 = local_4a0 + -1;
                local_49c = local_49c + -1;
                uVar3 = ref_cell_add(ref_cell,&local_4a8,&local_4d0);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x1bf,"ref_import_surf",(ulong)uVar3,"new qua");
                  return uVar3;
                }
                if (iVar4 != local_4d0) {
                  pcVar9 = "qua index";
                  uVar8 = 0x1c0;
                  goto LAB_0016c626;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_4e0);
            }
            fclose(__stream);
            return 0;
          }
          pcVar9 = "nnode";
          uVar8 = 0x196;
        }
        else {
          pcVar9 = "nqua";
          uVar8 = 0x195;
        }
      }
      else {
        pcVar9 = "ntri";
        uVar8 = 0x194;
      }
LAB_0016c626:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar8,"ref_import_surf",pcVar9);
      uVar3 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x18c,
           "ref_import_surf",(ulong)uVar3,"create grid");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_import_surf(REF_GRID *ref_grid_ptr,
                                          REF_MPI ref_mpi,
                                          const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua;
  REF_INT node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua, new_qua;
  REF_INT dummy;
  char buffer[1024];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &nnode), "nnode");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
    fgets(buffer, sizeof(buffer), file);
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    for (node = 0; node < 2; node++)
      RES(1, fscanf(file, "%d", &(dummy)), "extra 0 1");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 5; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
    for (node = 0; node < 2; node++)
      RES(1, fscanf(file, "%d", &(dummy)), "extra 0 1");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  fclose(file);

  return REF_SUCCESS;
}